

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O2

void __thiscall
duckdb::UniqueConstraint::UniqueConstraint
          (UniqueConstraint *this,LogicalIndex index,string *column_name_p,bool is_primary_key)

{
  UniqueConstraint(this,index,is_primary_key);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->columns,
             column_name_p);
  return;
}

Assistant:

UniqueConstraint::UniqueConstraint(const LogicalIndex index, string column_name_p, const bool is_primary_key)
    : UniqueConstraint(index, is_primary_key) {
	columns.push_back(std::move(column_name_p));
}